

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtls_test.cpp
# Opt level: O1

void __thiscall
ot::commissioner::DtlsTest_MbedtlsClientServer_Test::TestBody
          (DtlsTest_MbedtlsClientServer_Test *this)

{
  undefined1 *puVar1;
  _Alloc_hider _Var2;
  AssertHelper this_00;
  pointer puVar3;
  UdpSocket *this_01;
  undefined8 uVar4;
  char *pcVar5;
  initializer_list<unsigned_char> __l;
  AssertionResult gtest_ar_4;
  event_base *eventBase;
  AssertionResult gtest_ar_2;
  shared_ptr<ot::commissioner::UdpSocket> clientSocket;
  DtlsConfig config;
  shared_ptr<ot::commissioner::UdpSocket> serverSocket;
  int fail;
  ByteArray kHello;
  DtlsSession dtlsClient;
  DtlsSession dtlsServer;
  AssertHelper local_1a50;
  AssertHelper local_1a48;
  undefined8 *local_1a40;
  event_base *local_1a38;
  Error local_1a30;
  AssertHelper local_1a08;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1a00;
  DtlsConfig local_19f8;
  UdpSocket *local_1990;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1988;
  SocketPtr local_1980;
  SocketPtr local_1970;
  int local_195c;
  _Any_data local_1958;
  code *local_1948;
  code *pcStack_1940;
  _Any_data local_1938;
  code *local_1928;
  code *local_1920;
  _Any_data local_1918;
  code *local_1908;
  code *pcStack_1900;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_18f0;
  DtlsSession local_18d8;
  DtlsSession local_c88;
  
  local_c88.super_Endpoint._vptr_Endpoint =
       (_func_int **)CONCAT35(local_c88.super_Endpoint._vptr_Endpoint._5_3_,0x6f6c6c6568);
  __l._M_len = 5;
  __l._M_array = (iterator)&local_c88;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_18f0,__l,(allocator_type *)&local_18d8);
  local_19f8.mEnableDebugLogging = false;
  local_19f8.mLogLevel = 3;
  local_19f8.mPSK.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_19f8.mPSK.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_19f8.mPSK.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_19f8.mOwnKey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_19f8.mOwnKey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_19f8.mOwnKey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_19f8.mOwnCert.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_19f8.mOwnCert.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_19f8.mOwnCert.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_19f8.mCaChain.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_19f8.mCaChain.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_19f8.mCaChain.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  vector<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_c88,
             kServerTrustAnchor_abi_cxx11_,
             (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )(kServerTrustAnchor_abi_cxx11_._M_current + DAT_0027dbc8),
             (allocator_type *)&local_18d8);
  puVar3 = local_19f8.mCaChain.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  local_19f8.mCaChain.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_c88.super_Endpoint._vptr_Endpoint;
  local_19f8.mCaChain.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)local_c88.super_Endpoint.mReceiver.super__Function_base._M_functor._M_unused._0_8_;
  local_19f8.mCaChain.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)local_c88.super_Endpoint.mReceiver.super__Function_base._M_functor._8_8_;
  local_c88.super_Endpoint._vptr_Endpoint = (_func_int **)0x0;
  local_c88.super_Endpoint.mReceiver.super__Function_base._M_functor._M_unused._M_object =
       (uchar *)0x0;
  local_c88.super_Endpoint.mReceiver.super__Function_base._M_functor._8_8_ = (uchar *)0x0;
  if (puVar3 != (pointer)0x0) {
    operator_delete(puVar3);
  }
  if (local_c88.super_Endpoint._vptr_Endpoint != (_func_int **)0x0) {
    operator_delete(local_c88.super_Endpoint._vptr_Endpoint);
  }
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  vector<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_c88,
             kServerCert_abi_cxx11_,
             (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )(kServerCert_abi_cxx11_._M_current + DAT_0027dbe8),(allocator_type *)&local_18d8);
  puVar3 = local_19f8.mOwnCert.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  local_19f8.mOwnCert.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_c88.super_Endpoint._vptr_Endpoint;
  local_19f8.mOwnCert.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)local_c88.super_Endpoint.mReceiver.super__Function_base._M_functor._M_unused._0_8_;
  local_19f8.mOwnCert.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)local_c88.super_Endpoint.mReceiver.super__Function_base._M_functor._8_8_;
  local_c88.super_Endpoint._vptr_Endpoint = (_func_int **)0x0;
  local_c88.super_Endpoint.mReceiver.super__Function_base._M_functor._M_unused._M_object =
       (uchar *)0x0;
  local_c88.super_Endpoint.mReceiver.super__Function_base._M_functor._8_8_ = (uchar *)0x0;
  if (puVar3 != (pointer)0x0) {
    operator_delete(puVar3);
  }
  if (local_c88.super_Endpoint._vptr_Endpoint != (_func_int **)0x0) {
    operator_delete(local_c88.super_Endpoint._vptr_Endpoint);
  }
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  vector<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_c88,kServerKey_abi_cxx11_
             ,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               )(kServerKey_abi_cxx11_._M_current + DAT_0027dc08),(allocator_type *)&local_18d8);
  puVar3 = local_19f8.mOwnKey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  local_19f8.mOwnKey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_c88.super_Endpoint._vptr_Endpoint;
  local_19f8.mOwnKey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)local_c88.super_Endpoint.mReceiver.super__Function_base._M_functor._M_unused._0_8_;
  local_19f8.mOwnKey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)local_c88.super_Endpoint.mReceiver.super__Function_base._M_functor._8_8_;
  local_c88.super_Endpoint._vptr_Endpoint = (_func_int **)0x0;
  local_c88.super_Endpoint.mReceiver.super__Function_base._M_functor._M_unused._M_object =
       (undefined8 *)0x0;
  local_c88.super_Endpoint.mReceiver.super__Function_base._M_functor._8_8_ = 0;
  if (puVar3 != (pointer)0x0) {
    operator_delete(puVar3);
  }
  if (local_c88.super_Endpoint._vptr_Endpoint != (_func_int **)0x0) {
    operator_delete(local_c88.super_Endpoint._vptr_Endpoint);
  }
  local_c88.super_Endpoint._vptr_Endpoint =
       (_func_int **)((ulong)local_c88.super_Endpoint._vptr_Endpoint & 0xffffffffffffff00);
  if (local_19f8.mCaChain.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_19f8.mCaChain.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_realloc_insert<unsigned_char>
              (&local_19f8.mCaChain,
               (iterator)
               local_19f8.mCaChain.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
               ._M_impl.super__Vector_impl_data._M_finish,(uchar *)&local_c88);
  }
  else {
    *local_19f8.mCaChain.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
     super__Vector_impl_data._M_finish = '\0';
    local_19f8.mCaChain.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_19f8.mCaChain.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
         _M_impl.super__Vector_impl_data._M_finish + 1;
  }
  local_c88.super_Endpoint._vptr_Endpoint =
       (_func_int **)((ulong)local_c88.super_Endpoint._vptr_Endpoint & 0xffffffffffffff00);
  if (local_19f8.mOwnCert.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_19f8.mOwnCert.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_realloc_insert<unsigned_char>
              (&local_19f8.mOwnCert,
               (iterator)
               local_19f8.mOwnCert.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
               ._M_impl.super__Vector_impl_data._M_finish,(uchar *)&local_c88);
  }
  else {
    *local_19f8.mOwnCert.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
     super__Vector_impl_data._M_finish = '\0';
    local_19f8.mOwnCert.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_19f8.mOwnCert.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
         _M_impl.super__Vector_impl_data._M_finish + 1;
  }
  local_c88.super_Endpoint._vptr_Endpoint =
       (_func_int **)((ulong)local_c88.super_Endpoint._vptr_Endpoint & 0xffffffffffffff00);
  if (local_19f8.mOwnKey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_19f8.mOwnKey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_realloc_insert<unsigned_char>
              (&local_19f8.mOwnKey,
               (iterator)
               local_19f8.mOwnKey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_finish,(uchar *)&local_c88);
  }
  else {
    *local_19f8.mOwnKey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
     super__Vector_impl_data._M_finish = '\0';
    local_19f8.mOwnKey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_19f8.mOwnKey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
         _M_impl.super__Vector_impl_data._M_finish + 1;
  }
  local_1a38 = event_base_new();
  local_18d8.super_Endpoint._vptr_Endpoint = (_func_int **)0x0;
  testing::internal::CmpHelperNE<event_base*,decltype(nullptr)>
            ((internal *)&local_c88,"eventBase","nullptr",&local_1a38,(void **)&local_18d8);
  uVar4 = local_c88.super_Endpoint.mReceiver.super__Function_base._M_functor._M_unused._0_8_;
  if ((char)local_c88.super_Endpoint._vptr_Endpoint == '\0') {
    testing::Message::Message((Message *)&local_18d8);
    if ((undefined8 *)
        local_c88.super_Endpoint.mReceiver.super__Function_base._M_functor._M_unused._0_8_ ==
        (undefined8 *)0x0) {
      pcVar5 = anon_var_dwarf_434f87 + 9;
    }
    else {
      pcVar5 = *local_c88.super_Endpoint.mReceiver.super__Function_base._M_functor._M_unused.
                _M_object;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1a30,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/dtls_test.cpp"
               ,0x7d,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1a30,(Message *)&local_18d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1a30);
    if (local_18d8.super_Endpoint._vptr_Endpoint != (_func_int **)0x0) {
      (**(code **)(*local_18d8.super_Endpoint._vptr_Endpoint + 8))();
    }
    uVar4 = local_c88.super_Endpoint.mReceiver.super__Function_base._M_functor._M_unused._0_8_;
    if ((undefined8 *)
        local_c88.super_Endpoint.mReceiver.super__Function_base._M_functor._M_unused._0_8_ !=
        (undefined8 *)0x0) {
      if (*local_c88.super_Endpoint.mReceiver.super__Function_base._M_functor._M_unused._M_object !=
          local_c88.super_Endpoint.mReceiver.super__Function_base._M_functor._M_unused.
          _M_function_pointer + 0x10) {
        operator_delete(*local_c88.super_Endpoint.mReceiver.super__Function_base._M_functor.
                         _M_unused._M_object);
      }
      operator_delete((void *)uVar4);
    }
  }
  else {
    if ((undefined8 *)
        local_c88.super_Endpoint.mReceiver.super__Function_base._M_functor._M_unused._0_8_ !=
        (undefined8 *)0x0) {
      if (*local_c88.super_Endpoint.mReceiver.super__Function_base._M_functor._M_unused._M_object !=
          local_c88.super_Endpoint.mReceiver.super__Function_base._M_functor._M_unused.
          _M_function_pointer + 0x10) {
        operator_delete(*local_c88.super_Endpoint.mReceiver.super__Function_base._M_functor.
                         _M_unused._M_object);
      }
      operator_delete((void *)uVar4);
    }
    local_1990 = (UdpSocket *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<ot::commissioner::UdpSocket,std::allocator<ot::commissioner::UdpSocket>,event_base*&>
              (&local_1988,&local_1990,(allocator<ot::commissioner::UdpSocket> *)&local_c88,
               &local_1a38);
    this_01 = local_1990;
    puVar1 = (undefined1 *)((long)&local_c88.super_Endpoint.mReceiver + 8);
    local_c88.super_Endpoint._vptr_Endpoint = (_func_int **)puVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c88,"::","");
    local_1a30.mCode = UdpSocket::Bind(this_01,(string *)&local_c88,0x1633);
    local_1a08.data_ = (AssertHelperData *)((ulong)local_1a08.data_._4_4_ << 0x20);
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&local_18d8,"serverSocket->Bind(kServerAddr, kServerPort)","0",
               (int *)&local_1a30,(int *)&local_1a08);
    if (local_c88.super_Endpoint._vptr_Endpoint != (_func_int **)puVar1) {
      operator_delete(local_c88.super_Endpoint._vptr_Endpoint);
    }
    if ((char)local_18d8.super_Endpoint._vptr_Endpoint == '\0') {
      testing::Message::Message((Message *)&local_c88);
      if ((uchar *)local_18d8.super_Endpoint.mReceiver.super__Function_base._M_functor._M_unused.
                   _0_8_ == (uchar *)0x0) {
        pcVar5 = anon_var_dwarf_434f87 + 9;
      }
      else {
        pcVar5 = *local_18d8.super_Endpoint.mReceiver.super__Function_base._M_functor._M_unused.
                  _M_object;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_1a30,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/dtls_test.cpp"
                 ,0x80,pcVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_1a30,(Message *)&local_c88);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1a30);
      if (local_c88.super_Endpoint._vptr_Endpoint != (_func_int **)0x0) {
        (**(code **)(*local_c88.super_Endpoint._vptr_Endpoint + 8))();
      }
    }
    uVar4 = local_18d8.super_Endpoint.mReceiver.super__Function_base._M_functor._M_unused._0_8_;
    if ((uchar *)local_18d8.super_Endpoint.mReceiver.super__Function_base._M_functor._M_unused._0_8_
        != (uchar *)0x0) {
      if (*local_18d8.super_Endpoint.mReceiver.super__Function_base._M_functor._M_unused._M_object
          != local_18d8.super_Endpoint.mReceiver.super__Function_base._M_functor._M_unused.
             _M_function_pointer + 0x10) {
        operator_delete(*local_18d8.super_Endpoint.mReceiver.super__Function_base._M_functor.
                         _M_unused._M_object);
      }
      operator_delete((void *)uVar4);
    }
    local_1970.super___shared_ptr<ot::commissioner::Socket,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         &local_1990->super_Socket;
    local_1970.super___shared_ptr<ot::commissioner::Socket,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = local_1988._M_pi;
    if (local_1988._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_1988._M_pi)->_M_use_count = (local_1988._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_1988._M_pi)->_M_use_count = (local_1988._M_pi)->_M_use_count + 1;
      }
    }
    DtlsSession::DtlsSession(&local_c88,local_1a38,true,&local_1970);
    if (local_1970.super___shared_ptr<ot::commissioner::Socket,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_1970.super___shared_ptr<ot::commissioner::Socket,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    DtlsSession::Init((Error *)&local_18d8,&local_c88,&local_19f8);
    local_1a08.data_ = local_1a08.data_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<ot::commissioner::Error,ot::commissioner::ErrorCode>
              ((internal *)&local_1a30,"dtlsServer.Init(config)","ErrorCode::kNone",
               (Error *)&local_18d8,(ErrorCode *)&local_1a08);
    if ((_Manager_type *)
        local_18d8.super_Endpoint.mReceiver.super__Function_base._M_functor._M_unused._0_8_ !=
        (_Manager_type *)((long)&local_18d8.super_Endpoint.mReceiver + 0x10U)) {
      operator_delete(local_18d8.super_Endpoint.mReceiver.super__Function_base._M_functor._M_unused.
                      _M_object);
    }
    if ((undefined1)local_1a30.mCode == kNone) {
      testing::Message::Message((Message *)&local_18d8);
      if (local_1a30.mMessage._M_dataplus._M_p == (pointer)0x0) {
        pcVar5 = anon_var_dwarf_434f87 + 9;
      }
      else {
        pcVar5 = *(char **)local_1a30.mMessage._M_dataplus._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_1a08,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/dtls_test.cpp"
                 ,0x83,pcVar5);
      testing::internal::AssertHelper::operator=(&local_1a08,(Message *)&local_18d8);
      testing::internal::AssertHelper::~AssertHelper(&local_1a08);
      if (local_18d8.super_Endpoint._vptr_Endpoint != (_func_int **)0x0) {
        (**(code **)(*local_18d8.super_Endpoint._vptr_Endpoint + 8))();
      }
    }
    _Var2._M_p = local_1a30.mMessage._M_dataplus._M_p;
    if (local_1a30.mMessage._M_dataplus._M_p != (pointer)0x0) {
      if (*local_1a30.mMessage._M_dataplus._M_p != local_1a30.mMessage._M_dataplus._M_p + 0x10) {
        operator_delete(*local_1a30.mMessage._M_dataplus._M_p);
      }
      operator_delete(_Var2._M_p);
    }
    local_1918._8_8_ = local_1a38;
    pcStack_1900 = std::
                   _Function_handler<void_(ot::commissioner::Endpoint_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/dtls_test.cpp:133:28)>
                   ::_M_invoke;
    local_1908 = std::
                 _Function_handler<void_(ot::commissioner::Endpoint_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/dtls_test.cpp:133:28)>
                 ::_M_manager;
    local_1918._M_unused._M_object = &local_18f0;
    std::
    function<void_(ot::commissioner::Endpoint_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
    ::operator=(&local_c88.super_Endpoint.mReceiver,
                (function<void_(ot::commissioner::Endpoint_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
                 *)&local_1918);
    if (local_1908 != (code *)0x0) {
      (*local_1908)(&local_1918,&local_1918,__destroy_functor);
    }
    local_1938._M_unused._M_object = (void *)0x0;
    local_1938._8_8_ = 0;
    local_1920 = std::
                 _Function_handler<void_(ot::commissioner::DtlsSession_&,_ot::commissioner::Error),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/dtls_test.cpp:139:28)>
                 ::_M_invoke;
    local_1928 = std::
                 _Function_handler<void_(ot::commissioner::DtlsSession_&,_ot::commissioner::Error),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/dtls_test.cpp:139:28)>
                 ::_M_manager;
    DtlsSession::Connect(&local_c88,(ConnectHandler *)&local_1938);
    if (local_1928 != (code *)0x0) {
      (*local_1928)(&local_1938,&local_1938,__destroy_functor);
    }
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    vector<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_18d8,
               kClientTrustAnchor_abi_cxx11_,
               (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )(kClientTrustAnchor_abi_cxx11_._M_current + DAT_0027db68),
               (allocator_type *)&local_1a30);
    puVar3 = local_19f8.mCaChain.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    local_19f8.mCaChain.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_18d8.super_Endpoint._vptr_Endpoint;
    local_19f8.mCaChain.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)local_18d8.super_Endpoint.mReceiver.super__Function_base._M_functor._M_unused.
                  _0_8_;
    local_19f8.mCaChain.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)local_18d8.super_Endpoint.mReceiver.super__Function_base._M_functor._8_8_;
    local_18d8.super_Endpoint._vptr_Endpoint = (_func_int **)0x0;
    local_18d8.super_Endpoint.mReceiver.super__Function_base._M_functor._M_unused._M_object =
         (uchar *)0x0;
    local_18d8.super_Endpoint.mReceiver.super__Function_base._M_functor._8_8_ = (uchar *)0x0;
    if ((_func_int **)puVar3 != (_func_int **)0x0) {
      operator_delete(puVar3);
    }
    if (local_18d8.super_Endpoint._vptr_Endpoint != (_func_int **)0x0) {
      operator_delete(local_18d8.super_Endpoint._vptr_Endpoint);
    }
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    vector<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_18d8,
               kClientCert_abi_cxx11_,
               (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )(kClientCert_abi_cxx11_._M_current + DAT_0027db88),(allocator_type *)&local_1a30);
    puVar3 = local_19f8.mOwnCert.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    local_19f8.mOwnCert.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_18d8.super_Endpoint._vptr_Endpoint;
    local_19f8.mOwnCert.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)local_18d8.super_Endpoint.mReceiver.super__Function_base._M_functor._M_unused.
                  _0_8_;
    local_19f8.mOwnCert.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)local_18d8.super_Endpoint.mReceiver.super__Function_base._M_functor._8_8_;
    local_18d8.super_Endpoint._vptr_Endpoint = (_func_int **)0x0;
    local_18d8.super_Endpoint.mReceiver.super__Function_base._M_functor._M_unused._M_object =
         (uchar *)0x0;
    local_18d8.super_Endpoint.mReceiver.super__Function_base._M_functor._8_8_ = (uchar *)0x0;
    if ((_func_int **)puVar3 != (_func_int **)0x0) {
      operator_delete(puVar3);
    }
    if (local_18d8.super_Endpoint._vptr_Endpoint != (_func_int **)0x0) {
      operator_delete(local_18d8.super_Endpoint._vptr_Endpoint);
    }
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    vector<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_18d8,
               kClientKey_abi_cxx11_,
               (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )(kClientKey_abi_cxx11_._M_current + DAT_0027dba8),(allocator_type *)&local_1a30);
    puVar3 = local_19f8.mOwnKey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    local_19f8.mOwnKey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_18d8.super_Endpoint._vptr_Endpoint;
    local_19f8.mOwnKey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)local_18d8.super_Endpoint.mReceiver.super__Function_base._M_functor._M_unused.
                  _0_8_;
    local_19f8.mOwnKey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)local_18d8.super_Endpoint.mReceiver.super__Function_base._M_functor._8_8_;
    local_18d8.super_Endpoint._vptr_Endpoint = (_func_int **)0x0;
    local_18d8.super_Endpoint.mReceiver.super__Function_base._M_functor._M_unused._M_object =
         (uchar *)0x0;
    local_18d8.super_Endpoint.mReceiver.super__Function_base._M_functor._8_8_ = (uchar *)0x0;
    if ((_func_int **)puVar3 != (_func_int **)0x0) {
      operator_delete(puVar3);
    }
    if (local_18d8.super_Endpoint._vptr_Endpoint != (_func_int **)0x0) {
      operator_delete(local_18d8.super_Endpoint._vptr_Endpoint);
    }
    local_18d8.super_Endpoint._vptr_Endpoint =
         (_func_int **)((ulong)local_18d8.super_Endpoint._vptr_Endpoint & 0xffffffffffffff00);
    if (local_19f8.mCaChain.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        local_19f8.mCaChain.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_realloc_insert<unsigned_char>
                (&local_19f8.mCaChain,
                 (iterator)
                 local_19f8.mCaChain.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish,(uchar *)&local_18d8);
    }
    else {
      *local_19f8.mCaChain.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
       .super__Vector_impl_data._M_finish = '\0';
      local_19f8.mCaChain.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_19f8.mCaChain.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
    local_18d8.super_Endpoint._vptr_Endpoint =
         (_func_int **)((ulong)local_18d8.super_Endpoint._vptr_Endpoint & 0xffffffffffffff00);
    if (local_19f8.mOwnCert.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        local_19f8.mOwnCert.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_realloc_insert<unsigned_char>
                (&local_19f8.mOwnCert,
                 (iterator)
                 local_19f8.mOwnCert.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish,(uchar *)&local_18d8);
    }
    else {
      *local_19f8.mOwnCert.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
       .super__Vector_impl_data._M_finish = '\0';
      local_19f8.mOwnCert.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_19f8.mOwnCert.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
    local_18d8.super_Endpoint._vptr_Endpoint =
         (_func_int **)((ulong)local_18d8.super_Endpoint._vptr_Endpoint & 0xffffffffffffff00);
    if (local_19f8.mOwnKey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
        .super__Vector_impl_data._M_finish ==
        local_19f8.mOwnKey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_realloc_insert<unsigned_char>
                (&local_19f8.mOwnKey,
                 (iterator)
                 local_19f8.mOwnKey.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish,(uchar *)&local_18d8);
    }
    else {
      *local_19f8.mOwnKey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish = '\0';
      local_19f8.mOwnKey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_19f8.mOwnKey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
    local_1a08.data_ = (AssertHelperData *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<ot::commissioner::UdpSocket,std::allocator<ot::commissioner::UdpSocket>,event_base*&>
              (&local_1a00,(UdpSocket **)&local_1a08,
               (allocator<ot::commissioner::UdpSocket> *)&local_18d8,&local_1a38);
    this_00.data_ = local_1a08.data_;
    puVar1 = (undefined1 *)((long)&local_18d8.super_Endpoint.mReceiver + 8);
    local_18d8.super_Endpoint._vptr_Endpoint = (_func_int **)puVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_18d8,"::","");
    local_1a48.data_._0_4_ =
         UdpSocket::Connect((UdpSocket *)this_00.data_,(string *)&local_18d8,0x1633);
    local_1a50.data_._0_4_ = 0;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&local_1a30,"clientSocket->Connect(kServerAddr, kServerPort)","0",
               (int *)&local_1a48,(int *)&local_1a50);
    if (local_18d8.super_Endpoint._vptr_Endpoint != (_func_int **)puVar1) {
      operator_delete(local_18d8.super_Endpoint._vptr_Endpoint);
    }
    if ((undefined1)local_1a30.mCode == kNone) {
      testing::Message::Message((Message *)&local_18d8);
      if (local_1a30.mMessage._M_dataplus._M_p == (pointer)0x0) {
        pcVar5 = anon_var_dwarf_434f87 + 9;
      }
      else {
        pcVar5 = *(char **)local_1a30.mMessage._M_dataplus._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_1a48,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/dtls_test.cpp"
                 ,0x9b,pcVar5);
      testing::internal::AssertHelper::operator=(&local_1a48,(Message *)&local_18d8);
      testing::internal::AssertHelper::~AssertHelper(&local_1a48);
      if (local_18d8.super_Endpoint._vptr_Endpoint != (_func_int **)0x0) {
        (**(code **)(*local_18d8.super_Endpoint._vptr_Endpoint + 8))();
      }
    }
    _Var2._M_p = local_1a30.mMessage._M_dataplus._M_p;
    if (local_1a30.mMessage._M_dataplus._M_p != (pointer)0x0) {
      if (*local_1a30.mMessage._M_dataplus._M_p != local_1a30.mMessage._M_dataplus._M_p + 0x10) {
        operator_delete(*local_1a30.mMessage._M_dataplus._M_p);
      }
      operator_delete(_Var2._M_p);
    }
    local_1980.super___shared_ptr<ot::commissioner::Socket,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_1a08.data_;
    local_1980.super___shared_ptr<ot::commissioner::Socket,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = local_1a00._M_pi;
    if (local_1a00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_1a00._M_pi)->_M_use_count = (local_1a00._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_1a00._M_pi)->_M_use_count = (local_1a00._M_pi)->_M_use_count + 1;
      }
    }
    DtlsSession::DtlsSession(&local_18d8,local_1a38,false,&local_1980);
    if (local_1980.super___shared_ptr<ot::commissioner::Socket,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_1980.super___shared_ptr<ot::commissioner::Socket,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    DtlsSession::Init(&local_1a30,&local_18d8,&local_19f8);
    local_1a50.data_._0_4_ = 0;
    testing::internal::CmpHelperEQ<ot::commissioner::Error,ot::commissioner::ErrorCode>
              ((internal *)&local_1a48,"dtlsClient.Init(config)","ErrorCode::kNone",&local_1a30,
               (ErrorCode *)&local_1a50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a30.mMessage._M_dataplus._M_p != &local_1a30.mMessage.field_2) {
      operator_delete(local_1a30.mMessage._M_dataplus._M_p);
    }
    if (local_1a48.data_._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_1a30);
      if (local_1a40 == (undefined8 *)0x0) {
        pcVar5 = anon_var_dwarf_434f87 + 9;
      }
      else {
        pcVar5 = (char *)*local_1a40;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_1a50,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/dtls_test.cpp"
                 ,0x9e,pcVar5);
      testing::internal::AssertHelper::operator=(&local_1a50,(Message *)&local_1a30);
      testing::internal::AssertHelper::~AssertHelper(&local_1a50);
      if ((long *)CONCAT44(local_1a30._4_4_,local_1a30.mCode) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_1a30._4_4_,local_1a30.mCode) + 8))();
      }
    }
    if (local_1a40 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_1a40 != local_1a40 + 2) {
        operator_delete((undefined8 *)*local_1a40);
      }
      operator_delete(local_1a40);
    }
    local_1958._8_8_ = 0;
    pcStack_1940 = std::
                   _Function_handler<void_(ot::commissioner::DtlsSession_&,_ot::commissioner::Error),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/dtls_test.cpp:160:28)>
                   ::_M_invoke;
    local_1948 = std::
                 _Function_handler<void_(ot::commissioner::DtlsSession_&,_ot::commissioner::Error),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/dtls_test.cpp:160:28)>
                 ::_M_manager;
    local_1958._M_unused._M_object = &local_18f0;
    DtlsSession::Connect(&local_18d8,(ConnectHandler *)&local_1958);
    if (local_1948 != (code *)0x0) {
      (*local_1948)(&local_1958,&local_1958,__destroy_functor);
    }
    local_195c = event_base_loop(local_1a38,4);
    local_1a48.data_._0_4_ = 0;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&local_1a30,"fail","0",&local_195c,(int *)&local_1a48);
    if ((undefined1)local_1a30.mCode == kNone) {
      testing::Message::Message((Message *)&local_1a48);
      if (local_1a30.mMessage._M_dataplus._M_p == (pointer)0x0) {
        pcVar5 = anon_var_dwarf_434f87 + 9;
      }
      else {
        pcVar5 = *(char **)local_1a30.mMessage._M_dataplus._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_1a50,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/dtls_test.cpp"
                 ,0xa8,pcVar5);
      testing::internal::AssertHelper::operator=(&local_1a50,(Message *)&local_1a48);
      testing::internal::AssertHelper::~AssertHelper(&local_1a50);
      if ((long *)CONCAT44(local_1a48.data_._4_4_,(int)local_1a48.data_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_1a48.data_._4_4_,(int)local_1a48.data_) + 8))();
      }
      if (local_1a30.mMessage._M_dataplus._M_p != (pointer)0x0) {
        if (*local_1a30.mMessage._M_dataplus._M_p != local_1a30.mMessage._M_dataplus._M_p + 0x10) {
          operator_delete(*local_1a30.mMessage._M_dataplus._M_p);
        }
        operator_delete(local_1a30.mMessage._M_dataplus._M_p);
      }
    }
    else {
      if (local_1a30.mMessage._M_dataplus._M_p != (pointer)0x0) {
        if (*local_1a30.mMessage._M_dataplus._M_p != local_1a30.mMessage._M_dataplus._M_p + 0x10) {
          operator_delete(*local_1a30.mMessage._M_dataplus._M_p);
        }
        operator_delete(local_1a30.mMessage._M_dataplus._M_p);
      }
      event_base_free(local_1a38);
    }
    DtlsSession::~DtlsSession(&local_18d8);
    if (local_1a00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1a00._M_pi);
    }
    DtlsSession::~DtlsSession(&local_c88);
    if (local_1988._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1988._M_pi);
    }
  }
  if ((_func_int **)
      local_19f8.mCaChain.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (_func_int **)0x0) {
    operator_delete(local_19f8.mCaChain.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((_func_int **)
      local_19f8.mOwnCert.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (_func_int **)0x0) {
    operator_delete(local_19f8.mOwnCert.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((_func_int **)
      local_19f8.mOwnKey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (_func_int **)0x0) {
    operator_delete(local_19f8.mOwnKey.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_19f8.mPSK.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_19f8.mPSK.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_18f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_18f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST(DtlsTest, MbedtlsClientServer)
{
    const ByteArray kHello{'h', 'e', 'l', 'l', 'o'};

    DtlsConfig config;

    // Setup dtls server
    config.mCaChain = ByteArray{kServerTrustAnchor.begin(), kServerTrustAnchor.end()};
    config.mOwnCert = ByteArray{kServerCert.begin(), kServerCert.end()};
    config.mOwnKey  = ByteArray{kServerKey.begin(), kServerKey.end()};

    config.mCaChain.push_back(0);
    config.mOwnCert.push_back(0);
    config.mOwnKey.push_back(0);

    auto eventBase = event_base_new();
    ASSERT_NE(eventBase, nullptr);

    auto serverSocket = std::make_shared<UdpSocket>(eventBase);
    EXPECT_EQ(serverSocket->Bind(kServerAddr, kServerPort), 0);

    DtlsSession dtlsServer{eventBase, true, serverSocket};
    EXPECT_EQ(dtlsServer.Init(config), ErrorCode::kNone);

    dtlsServer.SetReceiver([&kHello, eventBase](Endpoint &, const ByteArray &aBuf) {
        EXPECT_EQ(aBuf, kHello);

        event_base_loopbreak(eventBase);
    });

    auto serverConnected = [](const DtlsSession &aSession, Error aError) {
        EXPECT_EQ(aError, ErrorCode::kNone);
        EXPECT_EQ(aSession.GetState(), DtlsSession::State::kConnected);
    };
    dtlsServer.Connect(serverConnected);

    // Setup dtls client
    config.mCaChain = ByteArray{kClientTrustAnchor.begin(), kClientTrustAnchor.end()};
    config.mOwnCert = ByteArray{kClientCert.begin(), kClientCert.end()};
    config.mOwnKey  = ByteArray{kClientKey.begin(), kClientKey.end()};

    config.mCaChain.push_back(0);
    config.mOwnCert.push_back(0);
    config.mOwnKey.push_back(0);

    auto clientSocket = std::make_shared<UdpSocket>(eventBase);
    EXPECT_EQ(clientSocket->Connect(kServerAddr, kServerPort), 0);

    DtlsSession dtlsClient{eventBase, false, clientSocket};
    EXPECT_EQ(dtlsClient.Init(config), ErrorCode::kNone);

    auto clientConnected = [&kHello](DtlsSession &aSession, Error aError) {
        EXPECT_EQ(aError, ErrorCode::kNone);
        EXPECT_EQ(aSession.GetState(), DtlsSession::State::kConnected);
        EXPECT_EQ(aSession.Send(kHello, MessageSubType::kNone), ErrorCode::kNone);
    };
    dtlsClient.Connect(clientConnected);

    int fail = event_base_loop(eventBase, EVLOOP_NO_EXIT_ON_EMPTY);
    ASSERT_EQ(fail, 0);
    event_base_free(eventBase);
}